

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Ray * __thiscall
pbrt::AnimatedTransform::operator()
          (Ray *__return_storage_ptr__,AnimatedTransform *this,Ray *r,Float *tMax)

{
  float time;
  Transform t;
  
  if ((this->actuallyAnimated == true) && (time = r->time, this->startTime < time)) {
    if (time < this->endTime) {
      Interpolate((Transform *)&stack0xffffffffffffff60,this,time);
      this = (AnimatedTransform *)&stack0xffffffffffffff60;
    }
    else {
      this = (AnimatedTransform *)&this->endTransform;
    }
  }
  Transform::operator()(__return_storage_ptr__,&this->startTransform,r,tMax);
  return __return_storage_ptr__;
}

Assistant:

Ray AnimatedTransform::operator()(const Ray &r, Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform(r, tMax);
    else if (r.time >= endTime)
        return endTransform(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t(r, tMax);
    }
}